

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsearch.h
# Opt level: O0

void __thiscall BuiltInTask::BuiltInTask(BuiltInTask *this,vw *vw_obj,search_task *task)

{
  undefined8 in_RDX;
  undefined8 *in_RDI;
  size_t num_actions;
  task_data *d;
  vw *in_stack_ffffffffffffffc8;
  SearchTask<std::vector<example_*,_std::allocator<example_*>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffffd0;
  size_t local_28;
  task_data *local_20;
  undefined8 local_18;
  
  local_18 = in_RDX;
  SearchTask<std::vector<example_*,_std::allocator<example_*>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::SearchTask(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *in_RDI = &PTR__BuiltInTask_00473ad8;
  local_20 = Search::search::get_task_data<HookTask::task_data>((search *)in_RDI[2]);
  local_28 = local_20->num_actions;
  in_RDI[5] = local_18;
  if (*(long *)(in_RDI[5] + 0x10) != 0) {
    (**(code **)(in_RDI[5] + 0x10))(in_RDI[2],&local_28,local_20->arg);
  }
  return;
}

Assistant:

BuiltInTask(vw& vw_obj, Search::search_task* task)
    : SearchTask< std::vector<example*>, vector<uint32_t> >(vw_obj)
  { HookTask::task_data* d = sch.get_task_data<HookTask::task_data>();
    size_t num_actions = d->num_actions;
    my_task = task;
    if (my_task->initialize)
      my_task->initialize(sch, num_actions, *d->arg);
  }